

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSMapRecord * map_add_record(JSContext *ctx,JSMapState *s,JSValue key)

{
  JSValue key_00;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  JSMapState *in_RSI;
  JSContext *in_RDI;
  JSValue JVar1;
  JSObject *p;
  JSMapRecord *mr;
  uint32_t h;
  list_head *in_stack_ffffffffffffffa8;
  JSValueUnion in_stack_ffffffffffffffb0;
  JSValueUnion in_stack_ffffffffffffffc0;
  JSContext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  JSMapRecord *local_8;
  
  local_8 = (JSMapRecord *)js_malloc(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  if (local_8 == (JSMapRecord *)0x0) {
    local_8 = (JSMapRecord *)0x0;
  }
  else {
    local_8->ref_count = 1;
    local_8->map = in_RSI;
    local_8->empty = 0;
    if (in_RSI->is_weak == 0) {
      JVar1.tag = in_RCX;
      JVar1.u.ptr = in_RDX.ptr;
      JVar1 = JS_DupValue(in_RDI,JVar1);
      in_stack_ffffffffffffffb0 = JVar1.u;
    }
    else {
      local_8->next_weak_ref = *(JSMapRecord **)((long)in_RDX.ptr + 0x28);
      *(JSMapRecord **)((long)in_RDX.ptr + 0x28) = local_8;
      in_stack_ffffffffffffffc0 = in_RDX;
    }
    (local_8->key).u.ptr = (void *)in_RDX;
    (local_8->key).tag = in_RCX;
    key_00.tag._0_4_ = in_stack_ffffffffffffffd0;
    key_00.u.ptr = local_8;
    key_00.tag._4_4_ = in_stack_ffffffffffffffd4;
    map_hash_key((JSContext *)in_stack_ffffffffffffffc0.ptr,key_00);
    list_add_tail((list_head *)in_stack_ffffffffffffffb0.ptr,in_stack_ffffffffffffffa8);
    list_add_tail((list_head *)in_stack_ffffffffffffffb0.ptr,in_stack_ffffffffffffffa8);
    in_RSI->record_count = in_RSI->record_count + 1;
    if (in_RSI->record_count_threshold <= in_RSI->record_count) {
      map_hash_resize(in_RDI,in_RSI);
    }
  }
  return local_8;
}

Assistant:

static JSMapRecord *map_add_record(JSContext *ctx, JSMapState *s,
                                   JSValueConst key)
{
    uint32_t h;
    JSMapRecord *mr;

    mr = js_malloc(ctx, sizeof(*mr));
    if (!mr)
        return NULL;
    mr->ref_count = 1;
    mr->map = s;
    mr->empty = FALSE;
    if (s->is_weak) {
        JSObject *p = JS_VALUE_GET_OBJ(key);
        /* Add the weak reference */
        mr->next_weak_ref = p->first_weak_ref;
        p->first_weak_ref = mr;
    } else {
        JS_DupValue(ctx, key);
    }
    mr->key = (JSValue)key;
    h = map_hash_key(ctx, key) & (s->hash_size - 1);
    list_add_tail(&mr->hash_link, &s->hash_table[h]);
    list_add_tail(&mr->link, &s->records);
    s->record_count++;
    if (s->record_count >= s->record_count_threshold) {
        map_hash_resize(ctx, s);
    }
    return mr;
}